

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

void force_wmtype(WarpedMotionParams *wm,TransformationType wmtype)

{
  int32_t iVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,wmtype);
  if (iVar2 == 0) {
    wm->wmmat[0] = 0;
    wm->wmmat[1] = 0;
LAB_0035328e:
    wm->wmmat[2] = 0x10000;
    wm->wmmat[3] = 0;
    iVar2 = 0;
    iVar1 = 0x10000;
  }
  else {
    if (iVar2 == 1) goto LAB_0035328e;
    if (iVar2 != 2) goto LAB_003532a5;
    iVar1 = wm->wmmat[2];
    iVar2 = wm->wmmat[3];
  }
  wm->wmmat[4] = -iVar2;
  wm->wmmat[5] = iVar1;
LAB_003532a5:
  wm->wmtype = wmtype;
  return;
}

Assistant:

static void force_wmtype(WarpedMotionParams *wm, TransformationType wmtype) {
  switch (wmtype) {
    case IDENTITY:
      wm->wmmat[0] = 0;
      wm->wmmat[1] = 0;
      AOM_FALLTHROUGH_INTENDED;
    case TRANSLATION:
      wm->wmmat[2] = 1 << WARPEDMODEL_PREC_BITS;
      wm->wmmat[3] = 0;
      AOM_FALLTHROUGH_INTENDED;
    case ROTZOOM:
      wm->wmmat[4] = -wm->wmmat[3];
      wm->wmmat[5] = wm->wmmat[2];
      AOM_FALLTHROUGH_INTENDED;
    case AFFINE: break;
    default: assert(0);
  }
  wm->wmtype = wmtype;
}